

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::dragMoveEvent(QGraphicsView *this,QDragMoveEvent *event)

{
  bool bVar1;
  QGraphicsViewPrivate *pQVar2;
  QObject *pQVar3;
  QGraphicsSceneDragDropEvent *in_RSI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QGraphicsSceneDragDropEvent sceneEvent;
  QGraphicsViewPrivate *in_stack_00000040;
  DropAction DVar4;
  QGraphicsSceneDragDropEvent *pQVar5;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsView *)0xa3d52a);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3d540);
  if ((bVar1) && ((*(uint *)&pQVar2->field_0x300 & 1) != 0)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent(in_RSI,(Type)((ulong)pQVar2 >> 0x20));
    QGraphicsViewPrivate::populateSceneDragDropEvent
              (in_stack_00000040,
               (QGraphicsSceneDragDropEvent *)sceneEvent.super_QGraphicsSceneEvent.d_ptr.d,
               (QDropEvent *)sceneEvent.super_QGraphicsSceneEvent._8_8_);
    QGraphicsViewPrivate::storeDragDropEvent
              (in_stack_00000040,
               (QGraphicsSceneDragDropEvent *)sceneEvent.super_QGraphicsSceneEvent.d_ptr.d);
    pQVar3 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3d5c5)->
              super_QObject;
    QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_20);
    pQVar5 = in_RSI;
    bVar1 = QEvent::isAccepted((QEvent *)&local_20);
    DVar4 = (DropAction)pQVar5;
    (**(code **)(*(long *)&in_RSI->super_QGraphicsSceneEvent + 0x10))(in_RSI,bVar1);
    bVar1 = QEvent::isAccepted((QEvent *)&local_20);
    if (bVar1) {
      QGraphicsSceneDragDropEvent::dropAction(in_RSI);
      QDropEvent::setDropAction(DVar4);
    }
    QGraphicsSceneDragDropEvent::~QGraphicsSceneDragDropEvent
              ((QGraphicsSceneDragDropEvent *)0xa3d634);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::dragMoveEvent(QDragMoveEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    // Generate a scene event.
    QGraphicsSceneDragDropEvent sceneEvent(QEvent::GraphicsSceneDragMove);
    d->populateSceneDragDropEvent(&sceneEvent, event);

    // Store it for later use.
    d->storeDragDropEvent(&sceneEvent);

    // Send it to the scene.
    QCoreApplication::sendEvent(d->scene, &sceneEvent);

    // Ignore the originating event if the scene ignored the scene event.
    event->setAccepted(sceneEvent.isAccepted());
    if (sceneEvent.isAccepted())
        event->setDropAction(sceneEvent.dropAction());
}